

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImVector_ImFontConfig *this_00;
  ImVector_ImFontPtr *this_01;
  ImFontConfig_conflict *pIVar1;
  ImFont **ppIVar2;
  int i;
  int iVar3;
  
  if (this->Locked == false) {
    this_00 = &this->ConfigData;
    for (iVar3 = 0; iVar3 < this_00->Size; iVar3 = iVar3 + 1) {
      pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)this_00,iVar3);
      if (pIVar1->FontData != (void *)0x0) {
        pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)this_00,iVar3);
        if (pIVar1->FontDataOwnedByAtlas == true) {
          pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)this_00,iVar3);
          ImGui::MemFree(pIVar1->FontData);
          pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)this_00,iVar3);
          pIVar1->FontData = (void *)0x0;
        }
      }
    }
    this_01 = &this->Fonts;
    for (iVar3 = 0; iVar3 < this_01->Size; iVar3 = iVar3 + 1) {
      ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this_01,iVar3);
      if ((ImFontConfig_conflict *)(this->ConfigData).Data <= (*ppIVar2)->ConfigData) {
        ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this_01,iVar3);
        if ((*ppIVar2)->ConfigData <
            (ImFontConfig_conflict *)((this->ConfigData).Data + (this->ConfigData).Size)) {
          ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this_01,iVar3);
          (*ppIVar2)->ConfigData = (ImFontConfig_conflict *)0x0;
          ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this_01,iVar3);
          (*ppIVar2)->ConfigDataCount = 0;
        }
      }
    }
    ImVector<ImFontConfig>::clear((ImVector<ImFontConfig> *)this_00);
    ImVector<ImFontAtlasCustomRect>::clear((ImVector<ImFontAtlasCustomRect> *)&this->CustomRects);
    this->PackIdMouseCursors = -1;
    this->PackIdLines = -1;
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                ,0x7c5,"void ImFontAtlas::ClearInputData()");
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}